

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

bool __thiscall Grid::slime(Grid *this,point p)

{
  bool bVar1;
  cg_box *pcVar2;
  uint *puVar3;
  cg_other *this_00;
  reference pcVar4;
  cgo_char *d;
  iterator __end1;
  iterator __begin1;
  vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *__range1;
  Grid *this_local;
  point p_local;
  
  pcVar2 = refc<cg_box>::operator->(&this->box);
  bVar1 = cg_box::contains(pcVar2,p);
  if (bVar1) {
    pcVar2 = refc<cg_box>::operator->(&this->box);
    puVar3 = (uint *)cg_box::at(pcVar2,p);
    p_local.x._3_1_ = (*puVar3 & this->SLIMEBIT) != 0;
  }
  else {
    this_00 = refc<cg_other>::operator->(&this->other);
    __end1 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::begin
                       (&this_00->data);
    d = (cgo_char *)
        std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::end(&this_00->data);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cg_other::cgo_char_*,_std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>_>
                                       *)&d), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<cg_other::cgo_char_*,_std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>_>
               ::operator*(&__end1);
      bVar1 = operator==(pcVar4->p,p);
      if (bVar1) {
        return (pcVar4->ch & this->SLIMEBIT) != 0;
      }
      __gnu_cxx::
      __normal_iterator<cg_other::cgo_char_*,_std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>_>
      ::operator++(&__end1);
    }
    p_local.x._3_1_ = false;
  }
  return p_local.x._3_1_;
}

Assistant:

bool Grid::slime(point p) {
    if (box->contains(p)) return !!(box->at(p) & SLIMEBIT);
    for (auto &d: other->data) {
        if (d.p == p) return !!(d.ch & SLIMEBIT);
    }
    return false;
}